

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

bool FastPForLib::Simple16<true>::tryme<1u,3u,4u,4u,3u,3u>(uint32_t *n,size_t len)

{
  uint *puVar1;
  uint32_t i_1;
  ulong uVar2;
  uint32_t i;
  uint uVar3;
  ulong uVar4;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar5;
  
  uVar2 = (ulong)(len != 0);
  uVar4 = 0;
  while (uVar2 != uVar4) {
    puVar1 = n + uVar4;
    uVar4 = uVar4 + 1;
    if (7 < *puVar1) {
      return false;
    }
  }
  uVar7 = (len - 1) + (ulong)(len == 0);
  uVar4 = 4;
  if (uVar7 < 4) {
    uVar4 = uVar7;
  }
  uVar3 = (uint)(len != 0) + (int)uVar4;
  uVar5 = (ulong)uVar3;
  do {
    if (uVar5 <= uVar2) {
      iVar6 = 3;
      if (uVar7 - uVar4 < 3) {
        iVar6 = (int)(uVar7 - uVar4);
      }
      do {
        bVar8 = iVar6 + uVar3 <= uVar5;
        if (bVar8) {
          return bVar8;
        }
        puVar1 = n + uVar5;
        uVar5 = uVar5 + 1;
      } while (*puVar1 < 8);
      return bVar8;
    }
    puVar1 = n + uVar2;
    uVar2 = uVar2 + 1;
  } while (*puVar1 < 0x10);
  return false;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min1 = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min1; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    len -= min1;
    const uint32_t min2 = (len < num2) ? static_cast<uint32_t>(len) : num2;

    for (uint32_t i = min1; i < min1 + min2; i++) {
      if ((n[i]) >= (1U << log2))
        return false;
    }
    len -= min2;
    const uint32_t min3 = static_cast<uint32_t>((len < num3) ? len : num3);
    for (uint32_t i = min1 + min2; i < min1 + min2 + min3; i++) {
      if ((n[i]) >= (1U << log3))
        return false;
    }
    return true;
  }